

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

bool ImGui::TableSetColumnIndex(int column_n)

{
  ImGuiTable *pIVar1;
  ImGuiTableColumn *pIVar2;
  int in_EDI;
  ImGuiTable *table;
  ImGuiContext *g;
  undefined4 in_stack_00000014;
  bool local_1;
  
  pIVar1 = GImGui->CurrentTable;
  if (pIVar1 == (ImGuiTable *)0x0) {
    local_1 = false;
  }
  else {
    if (pIVar1->CurrentColumn != in_EDI) {
      if (pIVar1->CurrentColumn != -1) {
        TableEndCell(table);
      }
      TableBeginCell((ImGuiTable *)CONCAT44(in_stack_00000014,column_n),g._4_4_);
    }
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&pIVar1->Columns,in_EDI);
    local_1 = (bool)(pIVar2->IsRequestOutput & 1);
  }
  return local_1;
}

Assistant:

bool ImGui::TableSetColumnIndex(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return false;

    if (table->CurrentColumn != column_n)
    {
        if (table->CurrentColumn != -1)
            TableEndCell(table);
        IM_ASSERT(column_n >= 0 && table->ColumnsCount);
        TableBeginCell(table, column_n);
    }

    // Return whether the column is visible. User may choose to skip submitting items based on this return value,
    // however they shouldn't skip submitting for columns that may have the tallest contribution to row height.
    return table->Columns[column_n].IsRequestOutput;
}